

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cn-cbor.c
# Opt level: O0

cn_cbor * cn_cbor_decode(uchar *buf,size_t len,cn_cbor_errback *errp)

{
  cn_cbor *ret;
  parse_buf pb;
  cn_cbor catcher;
  cn_cbor_errback *errp_local;
  size_t len_local;
  uchar *buf_local;
  
  memset(&pb.err,0,0x38);
  pb.err = 0x10;
  pb.buf = buf + len;
  pb.ebuf._0_4_ = CN_CBOR_NO_ERROR;
  ret = (cn_cbor *)buf;
  buf_local = (uchar *)decode_item((parse_buf *)&ret,(cn_cbor *)&pb.err);
  if ((cn_cbor *)buf_local == (cn_cbor *)0x0) {
    if (catcher._16_8_ != 0) {
      *(undefined8 *)(catcher._16_8_ + 0x30) = 0;
      cn_cbor_free((cn_cbor *)catcher._16_8_);
    }
    if (errp != (cn_cbor_errback *)0x0) {
      errp->err = (cn_cbor_error)pb.ebuf;
      errp->pos = (int)ret - (int)buf;
    }
    buf_local = (uchar *)0x0;
  }
  else {
    ((cn_cbor *)buf_local)->parent = (cn_cbor *)0x0;
  }
  return (cn_cbor *)buf_local;
}

Assistant:

MYLIB_EXPORT
cn_cbor* cn_cbor_decode(const unsigned char* buf, size_t len CBOR_CONTEXT, cn_cbor_errback *errp) {
  cn_cbor catcher = {CN_CBOR_INVALID, 0, {0}, 0, NULL, NULL, NULL, NULL};
  struct parse_buf pb;
  cn_cbor* ret;

  pb.buf  = (unsigned char *)buf;
  pb.ebuf = (unsigned char *)buf+len;
  pb.err  = CN_CBOR_NO_ERROR;
  ret = decode_item(&pb CBOR_CONTEXT_PARAM, &catcher);
  if (ret != NULL) {
    /* mark as top node */
    ret->parent = NULL;
  } else {
    if (catcher.first_child) {
      catcher.first_child->parent = 0;
      cn_cbor_free(catcher.first_child CBOR_CONTEXT_PARAM);
    }
//fail:
    if (errp) {
      errp->err = pb.err;
      errp->pos = pb.buf - (unsigned char *)buf;
    }
    return NULL;
  }
  return ret;
}